

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleCreateLinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  cmMakefile *this_00;
  __type _Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin0;
  pointer pbVar6;
  string *__rhs;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar7;
  string_view arg;
  string_view name;
  static_string_view name_00;
  static_string_view name_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  Arguments arguments;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  ostringstream e;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CREATE_LINK must be called with at least two additional arguments",
               (allocator<char> *)&arguments);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  if ((HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parser), iVar4 != 0)) {
    arguments.Result.field_2._M_allocated_capacity = 0;
    arguments.Result._M_dataplus._M_p = (pointer)0x0;
    arguments.Result._M_string_length = 0;
    _e = (cmArgumentParser<Arguments> *)0x0;
    name._M_str = "RESULT";
    name._M_len = 6;
    pVar7 = ArgumentParser::ActionMap::Emplace((ActionMap *)&arguments,name,(Action *)&e);
    std::_Function_base::~_Function_base((_Function_base *)&e);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h"
                    ,0x4b,
                    "cmArgumentParser<Result> &cmArgumentParser<Arguments>::Bind(cm::static_string_view, T Result::*) [Result = Arguments, T = std::basic_string<char>]"
                   );
    }
    name_00.super_string_view._M_str = "COPY_ON_ERROR";
    name_00.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&arguments,name_00,0x20);
    name_01.super_string_view._M_str = "SYMBOLIC";
    name_01.super_string_view._M_len = 8;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&arguments,name_01,0x21);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)&HandleCreateLinkCommand::parser,
             (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)&arguments);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
               *)&arguments);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleCreateLinkCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::parser);
  }
  __lhs = pbVar6 + 1;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  arguments.Result._M_dataplus._M_p = (pointer)&arguments.Result.field_2;
  arguments.Result._M_string_length = 0;
  arguments.Result.field_2._M_allocated_capacity =
       arguments.Result.field_2._M_allocated_capacity & 0xffffffffffffff00;
  arguments.CopyOnError = false;
  arguments.Symbolic = false;
  __rhs = pbVar6 + 2;
  _e = &HandleCreateLinkCommand::parser;
  for (pbVar6 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 3; pbVar6 != pbVar1;
      pbVar6 = pbVar6 + 1) {
    arg._M_str = (pbVar6->_M_dataplus)._M_p;
    arg._M_len = pbVar6->_M_string_length;
    ArgumentParser::Instance::Consume
              ((Instance *)&e,arg,&arguments,&unconsumedArgs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
  }
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&result,"unknown argument: \"",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&result,
                   '\"');
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&result);
    bVar3 = false;
    goto LAB_0017ffaf;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  _Var2 = std::operator==(__lhs,__rhs);
  if (_Var2) {
    std::__cxx11::string::assign((char *)&result);
LAB_0017fd3f:
    if (arguments.Result._M_string_length == 0) {
      cmCommand::SetError(&this->super_cmCommand,&result);
LAB_0017fdca:
      bVar3 = false;
    }
    else {
      bVar3 = true;
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&arguments.Result,result._M_dataplus._M_p);
    }
  }
  else {
    if ((arguments.Symbolic == false) && (bVar3 = cmsys::SystemTools::FileExists(__lhs), !bVar3)) {
      std::operator+(&local_248,"Cannot hard link \'",__lhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     &local_248,"\' as it does not exist.");
      std::__cxx11::string::operator=((string *)&result,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_248);
      goto LAB_0017fd3f;
    }
    bVar3 = cmsys::SystemTools::FileExists(__rhs);
    if (((!bVar3) && (bVar3 = cmsys::SystemTools::FileIsSymlink(__rhs), !bVar3)) ||
       (bVar3 = cmsys::SystemTools::RemoveFile(__rhs), bVar3)) {
      if (arguments.Symbolic == true) {
        bVar3 = cmSystemTools::CreateSymlink(__lhs,__rhs,&result);
      }
      else {
        bVar3 = cmSystemTools::CreateLink(__lhs,__rhs,&result);
      }
      if (bVar3 != false) {
LAB_0017feda:
        std::__cxx11::string::assign((char *)&result);
        if (arguments.Result._M_string_length == 0) {
          bVar3 = true;
        }
        else {
LAB_0017ff5d:
          bVar3 = true;
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&arguments.Result,result._M_dataplus._M_p);
        }
        goto LAB_0017ffa5;
      }
      if (arguments.CopyOnError == true) {
        bVar3 = cmsys::SystemTools::CopyFileAlways(__lhs,__rhs);
        if (bVar3) goto LAB_0017feda;
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       "Copy failed: ",&local_248);
        std::__cxx11::string::operator=((string *)&result,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::~string((string *)&local_248);
      }
      if (arguments.Result._M_string_length != 0) goto LAB_0017ff5d;
      cmCommand::SetError(&this->super_cmCommand,&result);
      goto LAB_0017fdca;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,"Failed to create link \'");
    poVar5 = std::operator<<(poVar5,(string *)__rhs);
    poVar5 = std::operator<<(poVar5,"\' because existing path cannot be removed: ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&local_248);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    bVar3 = arguments.Result._M_string_length != 0;
    if (arguments.Result._M_string_length == 0) {
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_248);
    }
    else {
      this_00 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(this_00,&arguments.Result,local_248._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
LAB_0017ffa5:
  std::__cxx11::string::~string((string *)&result);
LAB_0017ffaf:
  std::__cxx11::string::~string((string *)&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  return bVar3;
}

Assistant:

bool cmFileCommand::HandleCreateLinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("CREATE_LINK must be called with at least two additional "
                   "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    this->SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, e.str().c_str());
      return true;
    }
    this->SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    completed = cmSystemTools::CreateSymlink(fileName, newFileName, &result);
  } else {
    completed = cmSystemTools::CreateLink(fileName, newFileName, &result);
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    completed = cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (!completed) {
      result = "Copy failed: " + cmSystemTools::GetLastSystemError();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    this->SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    this->Makefile->AddDefinition(arguments.Result, result.c_str());
  }

  return true;
}